

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::updateTimeRange
          (ConstraintsGroup *this,string *name,TimeRange *timeRange)

{
  long lVar1;
  pointer psVar2;
  pointer psVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  iterator iVar8;
  ulong uVar9;
  ostream *poVar10;
  char *pcVar11;
  ConstraintsGroupPimpl *this_00;
  __normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
  __i;
  pointer psVar12;
  ostringstream errorMsg;
  long *local_1b8;
  long local_1a8 [2];
  TimeRange local_198 [4];
  ios_base local_128 [264];
  
  TimeRange::AnyTime();
  bVar7 = TimeRange::operator==(timeRange,local_198);
  if (bVar7) {
    this_00 = this->m_pimpl;
    if ((int)(this_00->group)._M_h._M_element_count != 1) {
      pcVar11 = "Only one constraint is allowed in a group if the timeRange is AnyTime.";
LAB_00175b5f:
      iDynTree::reportError("ConstraintsGroup","updateTimeRange",pcVar11);
      return false;
    }
  }
  else {
    bVar7 = TimeRange::isValid(timeRange);
    if (!bVar7) {
      pcVar11 = "Invalid timeRange.";
      goto LAB_00175b5f;
    }
    this_00 = this->m_pimpl;
  }
  iVar8 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this_00,name);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Unable to find constraint named ",0x20);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_198,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("ConstraintsGroup","updateTimeRange",(char *)local_1b8);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    return false;
  }
  lVar1 = *(long *)((long)iVar8.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
                          ._M_cur + 0x28);
  *(bool *)(lVar1 + 0x20) = timeRange->m_anyTime;
  uVar4 = *(undefined4 *)((long)&timeRange->m_initTime + 4);
  uVar5 = *(undefined4 *)&timeRange->m_endTime;
  uVar6 = *(undefined4 *)((long)&timeRange->m_endTime + 4);
  *(undefined4 *)(lVar1 + 0x10) = *(undefined4 *)&timeRange->m_initTime;
  *(undefined4 *)(lVar1 + 0x14) = uVar4;
  *(undefined4 *)(lVar1 + 0x18) = uVar5;
  *(undefined4 *)(lVar1 + 0x1c) = uVar6;
  psVar2 = (this->m_pimpl->orderedIntervals).
           super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->m_pimpl->orderedIntervals).
           super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar3) {
    uVar9 = (long)psVar3 - (long)psVar2 >> 4;
    lVar1 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::updateTimeRange(std::__cxx11::string_const&,iDynTree::optimalcontrol::TimeRange_const&)::__0>>
              (psVar2,psVar3,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)psVar3 - (long)psVar2 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::updateTimeRange(std::__cxx11::string_const&,iDynTree::optimalcontrol::TimeRange_const&)::__0>>
                (psVar2,psVar3);
      return true;
    }
    psVar12 = psVar2 + 0x10;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::updateTimeRange(std::__cxx11::string_const&,iDynTree::optimalcontrol::TimeRange_const&)::__0>>
              (psVar2,psVar12);
    for (; psVar12 != psVar3; psVar12 = psVar12 + 1) {
      std::
      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Val_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::updateTimeRange(std::__cxx11::string_const&,iDynTree::optimalcontrol::TimeRange_const&)::__0>>
                (psVar12);
    }
    return true;
  }
  return true;
}

Assistant:

bool ConstraintsGroup::updateTimeRange(const std::string &name, const TimeRange &timeRange)
        {
            if (timeRange == TimeRange::AnyTime()){
                if (numberOfConstraints() != 1){
                    reportError("ConstraintsGroup", "updateTimeRange",
                                "Only one constraint is allowed in a group if the timeRange is AnyTime.");
                    return false;
                }
            } else {
                if (!timeRange.isValid()){
                    reportError("ConstraintsGroup", "updateTimeRange", "Invalid timeRange.");
                    return false;
                }
            }

            GroupOfConstraintsMap::iterator constraintIterator;
            constraintIterator = m_pimpl->group.find(name);
            if(constraintIterator == m_pimpl->group.end()){
                std::ostringstream errorMsg;
                errorMsg << "Unable to find constraint named "<<name<< std::endl;
                reportError("ConstraintsGroup", "updateTimeRange", errorMsg.str().c_str());
                return false;
            }

            constraintIterator->second->timeRange = timeRange;
            std::sort(m_pimpl->orderedIntervals.begin(), m_pimpl->orderedIntervals.end(), [](const TimedConstraint_ptr&a, const TimedConstraint_ptr&b) { return a->timeRange < b->timeRange;}); //reorder the vector


            //the jacobian should be updated
            return true;
        }